

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook.cc
# Opt level: O1

bool __thiscall
base::internal::HookList<void_(*)(const_void_*)>::Add
          (HookList<void_(*)(const_void_*)> *this,_func_void_void_ptr *value)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  SpinLockHolder local_28;
  SpinLockHolder l;
  
  if (value == (_func_void_void_ptr *)0x0) {
    bVar3 = false;
  }
  else {
    local_28.lock_ = (SpinLock *)&hooklist_spinlock;
    LOCK();
    bVar3 = hooklist_spinlock == 0;
    if (bVar3) {
      hooklist_spinlock = 1;
    }
    UNLOCK();
    if (!bVar3) {
      SpinLock::SlowLock((SpinLock *)&hooklist_spinlock);
    }
    uVar2 = 0;
    do {
      if (this->priv_data[uVar2] == (_func_void_void_ptr *)0x0) goto LAB_0011fee3;
      uVar2 = uVar2 + 1;
    } while (uVar2 != 7);
    uVar2 = 7;
LAB_0011fee3:
    bVar3 = (int)uVar2 != 7;
    if ((bVar3) &&
       (uVar1 = (this->priv_end).super___atomic_base<unsigned_long>._M_i,
       this->priv_data[uVar2 & 0xffffffff] = value, uVar1 <= (uVar2 & 0xffffffff))) {
      (this->priv_end).super___atomic_base<unsigned_long>._M_i = (ulong)((int)uVar2 + 1);
    }
    SpinLockHolder::~SpinLockHolder(&local_28);
  }
  return bVar3;
}

Assistant:

bool HookList<T>::Add(T value) {
  if (value == T{}) {
    return false;
  }
  SpinLockHolder l(&hooklist_spinlock);
  // Find the first slot in data that is 0.
  int index = 0;
  while ((index < kHookListMaxValues) &&
         cast_priv_data(index)->load(std::memory_order_relaxed) != T{}) {
    ++index;
  }
  if (index == kHookListMaxValues) {
    return false;
  }
  uintptr_t prev_num_hooks = priv_end.load(std::memory_order_acquire);
  cast_priv_data(index)->store(value, std::memory_order_relaxed);
  if (prev_num_hooks <= index) {
    priv_end.store(index + 1, std::memory_order_relaxed);
  }
  return true;
}